

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  ulong uVar1;
  char *pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  undefined7 in_register_00000009;
  byte *pbVar11;
  byte *pbVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  long lVar17;
  byte bVar18;
  bool bVar19;
  bool bVar20;
  
  uVar15 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar15 == 1) {
    lVar7 = (long)length;
    lVar14 = 1;
    bVar4 = false;
    pbVar11 = (byte *)zNum;
  }
  else {
    uVar13 = 3 - uVar15;
    uVar10 = (ulong)uVar13;
    bVar4 = (int)uVar13 < length;
    if (((int)uVar13 < length) &&
       (uVar10 = 3 - (CONCAT71(in_register_00000009,enc) & 0xffffffff), zNum[uVar10] == '\0')) {
      uVar10 = 5 - (ulong)enc;
      do {
        bVar4 = (long)uVar10 < (long)length;
        if ((long)length <= (long)uVar10) goto LAB_00155cd8;
        uVar1 = uVar10 + 2;
        pcVar2 = zNum + uVar10;
        uVar10 = uVar1;
      } while (*pcVar2 == '\0');
      uVar10 = (ulong)((int)uVar1 - 2);
    }
LAB_00155cd8:
    lVar7 = (ulong)enc + (long)(int)uVar10 + -3;
    pbVar11 = (byte *)(zNum + (uVar15 & 1));
    lVar14 = 2;
  }
  pbVar8 = (byte *)(zNum + lVar7);
  bVar5 = true;
  for (; pbVar12 = pbVar11, pbVar11 < pbVar8; pbVar11 = pbVar11 + lVar14) {
    bVar18 = *pbVar11;
    if ((""[bVar18] & 1) == 0) {
      if (bVar18 == 0x2b) {
        pbVar11 = pbVar11 + lVar14;
        pbVar12 = pbVar11;
      }
      else if (bVar18 == 0x2d) {
        pbVar11 = pbVar11 + lVar14;
        bVar5 = false;
        pbVar12 = pbVar11;
      }
      break;
    }
  }
  for (; (pbVar11 < pbVar8 && (*pbVar11 == 0x30)); pbVar11 = pbVar11 + lVar14) {
  }
  bVar19 = pbVar11 >= pbVar8;
  if (pbVar11 < pbVar8) {
    bVar18 = *pbVar11;
    if ((byte)(bVar18 - 0x30) < 10) {
      lVar7 = 0;
      uVar15 = 0;
      pbVar16 = pbVar11;
      do {
        pbVar16 = pbVar16 + lVar14;
        lVar7 = (ulong)bVar18 + lVar7 * 10 + -0x30;
        uVar15 = uVar15 + (int)lVar14;
        bVar19 = pbVar8 <= pbVar16;
        if (bVar19) break;
        bVar18 = *pbVar16;
      } while ((byte)(bVar18 - 0x30) < 10);
    }
    else {
      lVar7 = 0;
      uVar15 = 0;
    }
    bVar20 = bVar18 == 0;
  }
  else {
    lVar7 = 0;
    bVar20 = true;
    uVar15 = 0;
  }
  lVar9 = -lVar7;
  if (bVar5) {
    lVar9 = lVar7;
  }
  lVar17 = -0x8000000000000000;
  if (-1 < lVar7) {
    lVar17 = lVar9;
  }
  *pNum = lVar17;
  iVar6 = 1;
  if ((((bVar19) || (bVar20)) && ((uVar15 != 0 || (pbVar12 != pbVar11)))) &&
     (uVar13 = (int)lVar14 * 0x13, !bVar4 && uVar15 <= uVar13)) {
    if (uVar13 <= uVar15) {
      uVar10 = 0;
      pbVar8 = pbVar11;
      do {
        bVar18 = *pbVar8;
        bVar3 = "922337203685477580"[uVar10];
        if (0x10 < uVar10) break;
        uVar10 = uVar10 + 1;
        pbVar8 = pbVar8 + lVar14;
      } while (bVar18 == bVar3);
      if (bVar18 == bVar3) {
        iVar6 = (char)pbVar11[lVar14 * 0x12] + -0x38;
      }
      else {
        iVar6 = ((int)(char)bVar18 - (int)(char)bVar3) * 10;
      }
      if (-1 < iVar6) {
        if (iVar6 != 0) {
          return 1;
        }
        return (uint)bVar5 * 2;
      }
    }
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = zNum+i+enc-3;
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = SMALLEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( (c!=0 && &zNum[i]<zEnd) || (i==0 && zStart==zNum) || i>19*incr || nonNum ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      assert( (*pNum)==SMALLEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}